

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O0

int main(int argc,char **argv)

{
  int status_00;
  lua_State *L_00;
  lua_State *L;
  char **ppcStack_18;
  int status;
  char **argv_local;
  int argc_local;
  
  if (*argv == (char *)0x0) {
    ppcStack_18 = empty_argv;
  }
  else {
    ppcStack_18 = argv;
    if (**argv != '\0') {
      progname = *argv;
    }
  }
  L_00 = luaL_newstate();
  if (L_00 == (lua_State *)0x0) {
    l_message("cannot create state: not enough memory");
    argv_local._4_4_ = 1;
  }
  else {
    smain.argv = ppcStack_18;
    smain.argc = argc;
    status_00 = lua_cpcall(L_00,pmain,(void *)0x0);
    report(L_00,status_00);
    lua_close(L_00);
    argv_local._4_4_ = (uint)(status_00 != 0 || 0 < smain.status);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
  int status;
  lua_State *L;
  if (!argv[0]) argv = empty_argv; else if (argv[0][0]) progname = argv[0];
  L = lua_open();
  if (L == NULL) {
    l_message("cannot create state: not enough memory");
    return EXIT_FAILURE;
  }
  smain.argc = argc;
  smain.argv = argv;
  status = lua_cpcall(L, pmain, NULL);
  report(L, status);
  lua_close(L);
  return (status || smain.status > 0) ? EXIT_FAILURE : EXIT_SUCCESS;
}